

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

Action<unsigned_short_(unsigned_short)> * __thiscall
testing::internal::ReturnAction::operator_cast_to_Action
          (Action<unsigned_short_(unsigned_short)> *__return_storage_ptr__,ReturnAction *this)

{
  undefined4 uVar1;
  ActionInterface<unsigned_short_(unsigned_short)> *pAVar2;
  
  pAVar2 = (ActionInterface<unsigned_short_(unsigned_short)> *)operator_new(0x10);
  pAVar2->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00198b70;
  uVar1 = **(undefined4 **)this;
  *(undefined4 *)&pAVar2[1]._vptr_ActionInterface = uVar1;
  *(short *)((long)&pAVar2[1]._vptr_ActionInterface + 4) = (short)uVar1;
  *(undefined8 *)&(__return_storage_ptr__->fun_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->fun_).super__Function_base._M_functor + 8) = 0;
  (__return_storage_ptr__->fun_).super__Function_base._M_manager = (_Manager_type)0x0;
  (__return_storage_ptr__->fun_)._M_invoker = (_Invoker_type)0x0;
  (__return_storage_ptr__->impl_).value_ = pAVar2;
  (__return_storage_ptr__->impl_).link_.next_ = &(__return_storage_ptr__->impl_).link_;
  return __return_storage_ptr__;
}

Assistant:

operator Action<F>() const {
    // Assert statement belongs here because this is the best place to verify
    // conditions on F. It produces the clearest error messages
    // in most compilers.
    // Impl really belongs in this scope as a local class but can't
    // because MSVC produces duplicate symbols in different translation units
    // in this case. Until MS fixes that bug we put Impl into the class scope
    // and put the typedef both here (for use in assert statement) and
    // in the Impl class. But both definitions must be the same.
    typedef typename Function<F>::Result Result;
    GTEST_COMPILE_ASSERT_(
        !is_reference<Result>::value,
        use_ReturnRef_instead_of_Return_to_return_a_reference);
    return Action<F>(new Impl<R, F>(value_));
  }